

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O3

vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
* __thiscall
CFG::filterAll0orAll1
          (vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
           *__return_storage_ptr__,CFG *this,
          vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
          *vector)

{
  ulong uVar1;
  uint uVar2;
  bool bVar3;
  _Bit_type *p_Var4;
  uint uVar5;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  *pvVar6;
  pointer pvVar7;
  int iVar8;
  ulong uVar9;
  ulong *puVar10;
  pointer __x;
  bool bVar11;
  pointer pvVar12;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  filtered;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  local_88;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  *local_70;
  pointer local_68;
  vector<bool,_std::allocator<bool>_> *local_60;
  vector<bool,_std::allocator<bool>_> local_58;
  
  local_88.
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __x = (vector->
        super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
  pvVar12 = (vector->
            super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if ((pvVar12 == __x) ||
     (pvVar6 = __return_storage_ptr__, pvVar7 = pvVar12,
     ((long)(__x->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
            _M_finish.super__Bit_iterator_base._M_p -
     (long)(__x->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p) * 8 +
     (ulong)(__x->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
            _M_finish.super__Bit_iterator_base._M_offset == 0)) {
    (__return_storage_ptr__->
    super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = __x;
    (__return_storage_ptr__->
    super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = pvVar12;
    (__return_storage_ptr__->
    super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage =
         (vector->
         super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
         )._M_impl.super__Vector_impl_data._M_end_of_storage;
    (vector->
    super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (vector->
    super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (vector->
    super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    do {
      local_68 = pvVar7;
      local_70 = pvVar6;
      std::vector<bool,_std::allocator<bool>_>::vector(&local_58,__x);
      uVar5 = local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_finish.super__Bit_iterator_base._M_offset;
      p_Var4 = local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_finish.super__Bit_iterator_base._M_p;
      if (local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_offset == 0 &&
          local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p ==
          local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_p) {
LAB_001162b7:
        operator_delete(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                        (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_end_of_storage -
                        (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      }
      else {
        uVar1 = *local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
        bVar11 = false;
        uVar9 = 0;
        puVar10 = local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
        local_60 = __x;
        do {
          bVar3 = !bVar11;
          bVar11 = true;
          if (bVar3) {
            if ((bool)((byte)uVar1 & 1) == ((*puVar10 >> (uVar9 & 0x3f) & 1) != 0)) {
              bVar11 = false;
            }
            else {
              std::
              vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
              ::push_back(&local_88,&local_58);
            }
          }
          iVar8 = (int)uVar9;
          puVar10 = puVar10 + (iVar8 == 0x3f);
          uVar2 = iVar8 + 1;
          if (iVar8 == 0x3f) {
            uVar2 = 0;
          }
          uVar9 = (ulong)uVar2;
        } while (uVar2 != uVar5 || puVar10 != p_Var4);
        __x = local_60;
        pvVar12 = local_68;
        if (local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p != (ulong *)0x0) goto LAB_001162b7;
      }
      __x = __x + 1;
      pvVar6 = local_70;
      pvVar7 = local_68;
    } while (__x != pvVar12);
    (local_70->
    super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start =
         local_88.
         super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (local_70->
    super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish =
         local_88.
         super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (local_70->
    super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_88.
         super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    __return_storage_ptr__ = local_70;
  }
  local_88.
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::~vector(&local_88);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<bool>> CFG::filterAll0orAll1(std::vector<std::vector<bool>> vector) {
    std::vector<std::vector<bool>> filtered;

    if (vector.size() == 0 or vector[0].size() == 0) return vector;

    for (auto permu: vector) {
        bool symbol = permu[0];
        bool done = false;
        for (auto el: permu) {
            if (!done and symbol != el) {
                filtered.push_back(permu);
                done = true;
            }
        }
    }
    return filtered;
}